

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fshook_stdio.c
# Opt level: O0

_Bool fs_stdio_remove_filename(char *path)

{
  _Bool _Var1;
  byte bVar2;
  ALLEGRO_FS_ENTRY *fp_00;
  undefined8 in_RDI;
  _Bool rc;
  ALLEGRO_FS_ENTRY *fp;
  int in_stack_00000024;
  char *in_stack_00000028;
  int in_stack_00000034;
  char *in_stack_00000038;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  _Bool local_1;
  
  fp_00 = fs_stdio_create_entry
                    ((char *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
  if (fp_00 == (ALLEGRO_FS_ENTRY *)0x0) {
    _Var1 = _al_trace_prefix(in_stack_00000038,in_stack_00000034,in_stack_00000028,in_stack_00000024
                             ,path);
    if (_Var1) {
      _al_trace_suffix("Cannot remove %s.",in_RDI);
    }
    local_1 = false;
  }
  else {
    bVar2 = fs_stdio_remove_entry(fp_00);
    fs_stdio_destroy_entry((ALLEGRO_FS_ENTRY *)CONCAT17(bVar2,in_stack_ffffffffffffffe0));
    local_1 = (_Bool)(bVar2 & 1);
  }
  return local_1;
}

Assistant:

static bool fs_stdio_remove_filename(const char *path)
{
   ALLEGRO_FS_ENTRY *fp;
   bool rc;

   fp = fs_stdio_create_entry(path);
   if (!fp) {
      ALLEGRO_WARN("Cannot remove %s.", path);
      return false;
   }

   rc = fs_stdio_remove_entry(fp);
   fs_stdio_destroy_entry(fp);
   return rc;
}